

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckCOSNSSubset(xmlSchemaWildcardPtr sub,xmlSchemaWildcardPtr super)

{
  bool bVar1;
  xmlSchemaWildcardNsPtr local_40;
  xmlSchemaWildcardNsPtr cur_1;
  xmlSchemaWildcardNsPtr pxStack_30;
  int found;
  xmlSchemaWildcardNsPtr curB;
  xmlSchemaWildcardNsPtr cur;
  xmlSchemaWildcardPtr super_local;
  xmlSchemaWildcardPtr sub_local;
  
  if (super->any == 0) {
    if (((sub->negNsSet == (xmlSchemaWildcardNsPtr)0x0) ||
        (super->negNsSet == (xmlSchemaWildcardNsPtr)0x0)) ||
       (sub->negNsSet->value != super->negNsSet->value)) {
      if (sub->nsSet != (xmlSchemaWildcardNsPtr)0x0) {
        if (super->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
          if (super->negNsSet != (xmlSchemaWildcardNsPtr)0x0) {
            local_40 = sub->nsSet;
            while( true ) {
              if (local_40 == (xmlSchemaWildcardNsPtr)0x0) {
                return 0;
              }
              if (local_40->value == super->negNsSet->value) break;
              local_40 = local_40->next;
            }
            return 1;
          }
        }
        else {
          bVar1 = false;
          for (curB = sub->nsSet; curB != (xmlSchemaWildcardNsPtr)0x0; curB = curB->next) {
            bVar1 = false;
            for (pxStack_30 = super->nsSet; pxStack_30 != (xmlSchemaWildcardNsPtr)0x0;
                pxStack_30 = pxStack_30->next) {
              if (curB->value == pxStack_30->value) {
                bVar1 = true;
                break;
              }
            }
            if (!bVar1) {
              return 1;
            }
          }
          if (bVar1) {
            return 0;
          }
        }
      }
      sub_local._4_4_ = 1;
    }
    else {
      sub_local._4_4_ = 0;
    }
  }
  else {
    sub_local._4_4_ = 0;
  }
  return sub_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckCOSNSSubset(xmlSchemaWildcardPtr sub,
			  xmlSchemaWildcardPtr super)
{
    /*
    * 1 super must be any.
    */
    if (super->any)
	return (0);
    /*
    * 2.1 sub must be a pair of not and a namespace name or `absent`.
    * 2.2 super must be a pair of not and the same value.
    */
    if ((sub->negNsSet != NULL) &&
	(super->negNsSet != NULL) &&
	(sub->negNsSet->value == super->negNsSet->value))
	return (0);
    /*
    * 3.1 sub must be a set whose members are either namespace names or `absent`.
    */
    if (sub->nsSet != NULL) {
	/*
	* 3.2.1 super must be the same set or a superset thereof.
	*/
	if (super->nsSet != NULL) {
	    xmlSchemaWildcardNsPtr cur, curB;
	    int found = 0;

	    cur = sub->nsSet;
	    while (cur != NULL) {
		found = 0;
		curB = super->nsSet;
		while (curB != NULL) {
		    if (cur->value == curB->value) {
			found = 1;
			break;
		    }
		    curB = curB->next;
		}
		if (!found)
		    return (1);
		cur = cur->next;
	    }
	    if (found)
		return (0);
	} else if (super->negNsSet != NULL) {
	    xmlSchemaWildcardNsPtr cur;
	    /*
	    * 3.2.2 super must be a pair of not and a namespace name or
	    * `absent` and that value must not be in sub's set.
	    */
	    cur = sub->nsSet;
	    while (cur != NULL) {
		if (cur->value == super->negNsSet->value)
		    return (1);
		cur = cur->next;
	    }
	    return (0);
	}
    }
    return (1);
}